

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe20At7(uint8_t *buf)

{
  uint64_t res;
  uint8_t *buf_local;
  
  return (long)((int)(uint)buf[3] >> 5) |
         ((ulong)CONCAT21(CONCAT11(*buf,buf[1]),buf[2]) & 0x1ffff) << 3;
}

Assistant:

std::uint64_t readFlUIntBe20At7(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 3;
    res |= (buf[3] >> 5);
    res &= UINT64_C(0xfffff);
    return res;
}